

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

BtorSimBitVector * btorsim_bv_copy(BtorSimBitVector *bv)

{
  BtorSimBitVector *pBVar1;
  
  pBVar1 = btorsim_bv_new(bv->width);
  memcpy(pBVar1 + 1,bv + 1,(ulong)bv->len << 2);
  return pBVar1;
}

Assistant:

BtorSimBitVector *
btorsim_bv_copy (const BtorSimBitVector *bv)
{
  assert (bv);

  BtorSimBitVector *res;

  res = btorsim_bv_new (bv->width);
  assert (res->width == bv->width);
  assert (res->len == bv->len);
  memcpy (res->bits, bv->bits, sizeof (*(bv->bits)) * bv->len);
  assert (btorsim_bv_compare (res, (BtorSimBitVector *) bv) == 0);
  return res;
}